

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

void __thiscall TPZIntTetra3D::SetOrder(TPZIntTetra3D *this,TPZVec<int> *ord,int type)

{
  int iVar1;
  int *piVar2;
  TPZIntRuleT3D *pTVar3;
  int in_EDX;
  TPZIntRuleList *in_RSI;
  long in_RDI;
  undefined4 local_2c;
  undefined4 local_24;
  
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,1);
  iVar1 = *piVar2;
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,0);
  if (*piVar2 < iVar1) {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,1);
    local_24 = *piVar2;
  }
  else {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,0);
    local_24 = *piVar2;
  }
  *(int *)(in_RDI + 8) = local_24;
  iVar1 = *(int *)(in_RDI + 8);
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,2);
  if (*piVar2 < iVar1) {
    local_2c = *(int *)(in_RDI + 8);
  }
  else {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,2);
    local_2c = *piVar2;
  }
  *(int *)(in_RDI + 8) = local_2c;
  if (0xe < *(int *)(in_RDI + 8)) {
    *(undefined4 *)(in_RDI + 8) = 0xe;
  }
  pTVar3 = TPZIntRuleList::GetRuleT3D(in_RSI,in_EDX);
  *(TPZIntRuleT3D **)(in_RDI + 0x10) = pTVar3;
  iVar1 = TPZIntRuleT3D::Order(*(TPZIntRuleT3D **)(in_RDI + 0x10));
  *(int *)(in_RDI + 8) = iVar1;
  return;
}

Assistant:

void TPZIntTetra3D::SetOrder(TPZVec<int> &ord,int type) {
	fOrdKsi = (ord[1] > ord[0]) ? ord[1] : ord[0];
	fOrdKsi = (fOrdKsi > ord[2]) ? fOrdKsi : ord[2];
	if(fOrdKsi > TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER) {
#ifdef PZDEBUG
#ifdef PZ_LOG
            if(logger.isWarnEnabled())
            {
                std::stringstream sout;
                sout << "Integration rule for tetrahedra - Order is bigger than NRULESTETRAHEDRA_ORDER (Max)";
                sout << " fOrdKsi " << fOrdKsi << " TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER " << TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER;
                LOGPZ_WARN(logger, sout.str())
            }
#endif
#endif
		fOrdKsi = TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER;
	}
	fIntKsi = TPZIntRuleList::gIntRuleList.GetRuleT3D(fOrdKsi);
    fOrdKsi = fIntKsi->Order();
}